

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

Token * __thiscall
Tokenizer::parseString(Token *__return_storage_ptr__,Tokenizer *this,char closing)

{
  bool bVar1;
  _Optional_base<char,_true,_true> _Var2;
  TokenizerException *pTVar3;
  long *plVar4;
  size_type *psVar5;
  string res;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_58;
  byte local_38;
  
  local_70 = 0;
  local_68 = 0;
  local_78 = &local_68;
  _Var2._M_payload.super__Optional_payload_base<char> =
       (_Optional_payload<char,_true,_true,_true>)next(this);
  if (((ushort)_Var2._M_payload.super__Optional_payload_base<char> >> 8 & 1) == 0) {
    pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Expected closing ","");
    std::operator+(&local_98,&local_b8,closing);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
    local_d8._M_dataplus._M_p = (pointer)*plVar4;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_d8._M_dataplus._M_p == psVar5) {
      local_d8.field_2._M_allocated_capacity = *psVar5;
      local_d8.field_2._8_8_ = plVar4[3];
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar5;
    }
    local_d8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    TokenizerException::TokenizerException
              (pTVar3,&local_d8,this->line_number,this->col_number,&this->current_line);
    __cxa_throw(pTVar3,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = false;
  do {
    if (bVar1) {
      doBackslash(_Var2._M_payload.super__Optional_payload_base<char>._M_payload);
LAB_00107a62:
      std::__cxx11::string::push_back((char)&local_78);
      bVar1 = false;
    }
    else {
      bVar1 = true;
      if (_Var2._M_payload.super__Optional_payload_base<char>._M_payload != '\\') goto LAB_00107a62;
    }
    _Var2._M_payload.super__Optional_payload_base<char> =
         (_Optional_payload<char,_true,_true,_true>)next(this);
    if (((ushort)_Var2._M_payload.super__Optional_payload_base<char> >> 8 & 1) == 0) {
      pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Expected closing ","");
      std::operator+(&local_98,&local_b8,closing);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
      local_d8._M_dataplus._M_p = (pointer)*plVar4;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_d8._M_dataplus._M_p == psVar5) {
        local_d8.field_2._M_allocated_capacity = *psVar5;
        local_d8.field_2._8_8_ = plVar4[3];
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar5;
      }
      local_d8._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      TokenizerException::TokenizerException
                (pTVar3,&local_d8,this->line_number,this->col_number,&this->current_line);
      __cxa_throw(pTVar3,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (!(bool)(_Var2._M_payload.super__Optional_payload_base<char>._M_payload != closing | bVar1))
    {
      next(this);
      local_58._M_rest._0_8_ = (undefined8)((long)&local_58 + 0x10);
      std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_78,local_78 + local_70);
      local_38 = 2;
      __return_storage_ptr__->type = String;
      std::__detail::__variant::
      _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                         *)&__return_storage_ptr__->value,
                        (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                         *)&local_58._M_first);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
        ::_S_vtable._M_arr[local_38]._M_data)
                ((anon_class_1_0_00000001 *)&local_d8,
                 (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                  *)&local_58);
      local_38 = 0xff;
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Token Tokenizer::parseString(char closing) {
    string res;
    char c;
    optional<char> _;
    _ = next();
    if (!_.has_value()) {
        throw TokenizerException(string("Expected closing ") + closing + ", got EOF", line_number, col_number,
                                 current_line);
    }
    c = _.value();
    bool backslash = false;
    do {
        if (backslash) {
            backslash = false;
            res += doBackslash(c);
        } else {
            if (c == '\\')
                backslash = true;
            else {
                backslash = false;
                res += c;
            }
        }
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException(string("Expected closing ") + closing + ", got EOF", line_number, col_number,
                                     current_line);
        }
        c = _.value();
    } while (c != closing || backslash);
    next();
    return Token(String, res);
}